

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O3

void __thiscall helics::TimeoutMonitor::pingSub(TimeoutMonitor *this,CoreBroker *brk)

{
  pointer *pplVar1;
  pointer pBVar2;
  iterator __position;
  bool bVar3;
  rep rVar4;
  pointer plVar5;
  long lVar6;
  pointer pBVar7;
  GlobalFederateId *pGVar8;
  long lVar9;
  long lVar10;
  ActionMessage png;
  ActionMessage local_e8;
  
  rVar4 = std::chrono::_V2::steady_clock::now();
  pBVar7 = (brk->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (brk->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar7 != pBVar2) {
    bVar3 = false;
LAB_00320b98:
    do {
      plVar5 = (this->connections).
               super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __position._M_current =
           (this->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      lVar10 = (long)__position._M_current - (long)plVar5 >> 4;
      lVar6 = (long)__position._M_current - (long)plVar5;
      if (lVar6 != 0) {
        pGVar8 = &plVar5->connection;
        lVar9 = 0;
        do {
          if (pGVar8->gid == (pBVar7->global_id).gid) goto LAB_00320c20;
          lVar9 = lVar9 + 1;
          pGVar8 = pGVar8 + 4;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar9);
      }
      if (__position._M_current ==
          (this->connections).
          super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
        _M_realloc_insert<>(&this->connections,__position);
      }
      else {
        (__position._M_current)->waitingForPingReply = false;
        (__position._M_current)->activeConnection = false;
        (__position._M_current)->disablePing = false;
        (__position._M_current)->field_0x3 = 0;
        (__position._M_current)->connection = 0;
        ((__position._M_current)->lastPing).__d.__r = 0;
        pplVar1 = &(this->connections).
                   super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pplVar1 = *pplVar1 + 1;
      }
      plVar5 = (this->connections).
               super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(BaseType *)((long)plVar5 + lVar6 + 4) = (pBVar7->global_id).gid;
      *(bool *)((long)plVar5 + lVar6 + 2) = pBVar7->_disable_ping;
      lVar9 = lVar10;
LAB_00320c20:
      if (pBVar7->state < ERROR_STATE) {
        if (plVar5[lVar9].disablePing == false) {
          plVar5 = plVar5 + lVar9;
          plVar5->waitingForPingReply = true;
          plVar5->activeConnection = true;
          (plVar5->lastPing).__d.__r = rVar4;
          ActionMessage::ActionMessage(&local_e8,(uint)pBVar7->_core + cmd_broker_setup | cmd_ping);
          local_e8.source_id.gid = (brk->super_BrokerBase).global_broker_id_local.gid;
          local_e8.dest_id.gid = (pBVar7->global_id).gid;
          (*(brk->super_Broker)._vptr_Broker[0x22])(brk,(ulong)(uint)(pBVar7->route).rid,&local_e8);
          ActionMessage::~ActionMessage(&local_e8);
          pBVar7 = pBVar7 + 1;
          bVar3 = true;
          if (pBVar7 == pBVar2) goto LAB_00320cb9;
          goto LAB_00320b98;
        }
      }
      else {
        plVar5[lVar9].activeConnection = false;
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar2);
    if (!bVar3) {
      return;
    }
LAB_00320cb9:
    ActionMessage::ActionMessage(&local_e8,cmd_broker_configure);
    local_e8.dest_id.gid = (brk->super_BrokerBase).global_id._M_i.gid;
    local_e8.source_id.gid = (brk->super_BrokerBase).global_id._M_i.gid;
    local_e8.messageID = 0x25f;
    local_e8.flags._0_1_ = (byte)local_e8.flags | 0x20;
    BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_e8);
    ActionMessage::~ActionMessage(&local_e8);
  }
  return;
}

Assistant:

void TimeoutMonitor::pingSub(CoreBroker* brk)
{
    auto now = std::chrono::steady_clock::now();
    bool activePing = false;
    for (const auto& brkr : brk->mBrokers) {
        size_t cindex = connections.size();
        for (size_t ii = 0; ii < cindex; ++ii) {
            if (connections[ii].connection == brkr.global_id) {
                cindex = ii;
                break;
            }
        }
        if (cindex == connections.size()) {
            connections.emplace_back();
            connections[cindex].connection = brkr.global_id;
            connections[cindex].disablePing = brkr._disable_ping;
        }

        if (brkr.state < ConnectionState::ERROR_STATE) {
            if (connections[cindex].disablePing) {
                continue;
            }
            connections[cindex].activeConnection = true;
            connections[cindex].waitingForPingReply = true;
            connections[cindex].lastPing = now;
            // send the ping
            ActionMessage png(brkr._core ? CMD_PING : CMD_BROKER_PING);
            png.source_id = brk->global_broker_id_local;
            png.dest_id = brkr.global_id;
            brk->transmit(brkr.route, png);
            activePing = true;
        } else {
            connections[cindex].activeConnection = false;
        }
    }
    if (activePing) {
        ActionMessage tickf(CMD_BROKER_CONFIGURE);
        tickf.dest_id = GlobalFederateId(brk->global_id);
        tickf.source_id = GlobalFederateId(brk->global_id);
        tickf.messageID = REQUEST_TICK_FORWARDING;
        setActionFlag(tickf, indicator_flag);
        brk->addActionMessage(tickf);
    }
}